

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec.h
# Opt level: O2

void cppcms::impl::details::decimal_traits<true>::conv<long_long>
               (longlong v,char **begin,char **buf)

{
  char *pcVar1;
  
  if (-1 < v) {
    decimal_traits<false>::conv<long_long>(v,begin,buf);
    return;
  }
  pcVar1 = *buf;
  *buf = pcVar1 + 1;
  *pcVar1 = '-';
  *begin = *buf;
  for (; v != 0; v = v / 10) {
    pcVar1 = *buf;
    *buf = pcVar1 + 1;
    *pcVar1 = '0' - (char)(v % 10);
  }
  return;
}

Assistant:

static void conv(T v,char *&begin,char *&buf)
				{
					if(v<0) {
						*buf++ = '-';
						begin=buf;
						while(v!=0) {
							*buf++ = '0' - (v % 10);
							v/=10;
						}
					}
					else {
						decimal_traits<false>::conv(v,begin,buf);
					}
				}